

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_01;
  const_iterator cVar1;
  pair<int,_int> pVar2;
  pointer ppVar3;
  size_type old_bucket_count;
  AssertionResult gtest_ar_1;
  TypeParam ht;
  TransparentHasher local_140;
  SetKey local_132;
  Identity local_131;
  Hasher local_130;
  value_type local_120;
  pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_118;
  undefined1 local_c8 [50];
  undefined1 local_96;
  int local_84;
  int local_80;
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  local_70;
  value_type local_38;
  
  pVar2 = UniqueObjectHelper<std::pair<int,int>>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  ((type *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.key_info + 0xc))->first = pVar2.first;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0x10) = pVar2.second;
  local_120 = *(value_type *)
               ((long)&(this->
                       super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       ).
                       super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.
                       super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.rep.table + 0x38);
  local_118.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(4);
  google::
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert((pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
            *)local_c8,this_00,(value_type *)&local_118);
  local_c8._0_8_ = UniqueObjectHelper<std::pair<int,int>>(4);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_c8);
  local_118.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(4);
  google::
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert((pair<google::sparse_hashtable_const_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
            *)local_c8,this_00,(value_type *)&local_118);
  local_c8._0_8_ = UniqueObjectHelper<std::pair<int,int>>(4);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_c8);
  local_118.first.ht =
       *(sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         **)((long)&(this->
                    super_HashtableAllTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    ).
                    super_HashtableTest<google::HashtableInterface_SparseHashSet<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.
                    super_BaseHashtableInterface<google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    .ht_.rep.table + 0x38);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c8,"old_bucket_count","this->ht_.bucket_count()",
             (unsigned_long *)&local_120,(unsigned_long *)&local_118);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_118);
    if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)local_c8._8_8_ ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = *(pointer *)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x583,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_140,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_140);
    if (local_118.first.ht !=
        (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_118.first.ht)->settings).
                             super_sh_hashtable_settings<std::pair<int,_int>,_TransparentHasher,_unsigned_long,_4>
                             .super_TransparentHasher.super_Hasher + 8))();
    }
  }
  if ((sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)local_c8._8_8_ !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if (*(pointer *)local_c8._8_8_ !=
        (pointer)&(((Settings *)(local_c8._8_8_ + 8))->
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  ).super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_)
    {
      operator_delete(*(pointer *)local_c8._8_8_);
    }
    operator_delete((void *)local_c8._8_8_);
  }
  local_140.super_Hasher.id_ = 0;
  local_140.super_Hasher.num_hashes_ = 0;
  local_140.super_Hasher.num_compares_ = 0;
  local_130.id_ = 0;
  local_130.num_hashes_ = 0;
  local_130.num_compares_ = 0;
  local_118.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_118.first.ht & 0xffffffff00000000);
  local_118.first.pos.row_begin._M_current =
       (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  this_01 = (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_c8 + 8);
  local_c8._0_8_ = &PTR__BaseHashtableInterface_00c26c48;
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(this_01,2,&local_140,(TransparentHasher *)&local_130,&local_131,&local_132,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)&local_118);
  local_c8._0_8_ = &PTR__BaseHashtableInterface_00c26bc8;
  local_140.super_Hasher.id_ = local_38.first;
  local_140.super_Hasher.num_hashes_ = local_38.second;
  local_130.id_ = 0x20;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((internal *)&local_118,"ht.bucket_count()","32u",(unsigned_long *)&local_140,
             (uint *)&local_130);
  if ((char)local_118.first.ht == '\0') {
    testing::Message::Message((Message *)&local_140);
    if (local_118.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_118.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x587,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((value_type)local_140.super_Hasher._0_8_ != (value_type)0x0) {
      (**(code **)(*(long *)local_140.super_Hasher._0_8_ + 8))();
    }
  }
  cVar1._M_current = local_118.first.pos.row_begin._M_current;
  if (local_118.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_118.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_118.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_118.first.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar1._M_current);
  }
  pVar2 = UniqueObjectHelper<std::pair<int,int>>(1);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(this_01);
  local_96 = 1;
  local_84 = pVar2.first;
  local_80 = pVar2.second;
  local_120 = local_38;
  local_140.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(4);
  google::
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert(&local_118,
           (sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)this_01,(value_type *)&local_140);
  local_118.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(4);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(this_01,(key_type *)&local_118);
  local_140.super_Hasher._0_8_ = UniqueObjectHelper<std::pair<int,int>>(4);
  google::
  sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::insert(&local_118,
           (sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
            *)this_01,(value_type *)&local_140);
  local_118.first.ht =
       (sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)UniqueObjectHelper<std::pair<int,int>>(4);
  google::
  sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<std::pair<int,_int>,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(this_01,(key_type *)&local_118);
  local_140.super_Hasher.id_ = local_38.first;
  local_140.super_Hasher.num_hashes_ = local_38.second;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_118,"old_bucket_count","ht.bucket_count()",
             (unsigned_long *)&local_120,(unsigned_long *)&local_140);
  if ((char)local_118.first.ht == '\0') {
    testing::Message::Message((Message *)&local_140);
    if (local_118.first.pos.row_begin._M_current ==
        (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppVar3 = (pointer)0xafc493;
    }
    else {
      ppVar3 = (local_118.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x58e,(char *)ppVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((value_type)local_140.super_Hasher._0_8_ != (value_type)0x0) {
      (**(code **)(*(long *)local_140.super_Hasher._0_8_ + 8))();
    }
  }
  cVar1._M_current = local_118.first.pos.row_begin._M_current;
  if (local_118.first.pos.row_begin._M_current !=
      (sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((local_118.first.pos.row_begin._M_current)->group !=
        (pointer)&((local_118.first.pos.row_begin._M_current)->settings).
                  super_alloc_impl<Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>
                  .super_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_118.first.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar1._M_current);
  }
  local_c8._0_8_ = &PTR__BaseHashtableInterface_00c26c48;
  std::
  vector<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<int,_int>,_(unsigned_short)48,_Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_70);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeHysteresis) {
  // We want to make sure that when we create a hashtable, and then
  // add and delete one element, the size of the hashtable doesn't
  // change.
  this->ht_.set_deleted_key(this->UniqueKey(1));
  typename TypeParam::size_type old_bucket_count = this->ht_.bucket_count();
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, this->ht_.bucket_count());

  // Try it again, but with a hashtable that starts very small
  TypeParam ht(2);
  EXPECT_LT(ht.bucket_count(), 32u);  // verify we really do start small
  ht.set_deleted_key(this->UniqueKey(1));
  old_bucket_count = ht.bucket_count();
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, ht.bucket_count());
}